

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

bool density_tests::detail::
     PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  local_48;
  undefined1 local_30 [8];
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  put;
  EasyRandom *i_rand_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *queue_local;
  
  put.m_put_data.m_user_storage = i_rand;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
            (&local_48,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)queue
            );
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
  ::
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data,void>
            ((put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
              *)local_30,&local_48);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::~put_transaction(&local_48);
  PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
  ::
  put_impl<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>>
            ((put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
              *)local_30,(EasyRandom *)put.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::commit((put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
            *)local_30);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::~put_transaction((put_transaction<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
                      *)local_30);
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                auto put = queue.template start_emplace<ElementType>();
                put_impl(put, i_rand);
                put.commit();
                return true;
            }